

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void RAWToRGB24Row_C(uint8 *src_raw,uint8 *dst_rgb24,int width)

{
  uint8 uVar1;
  uint8 uVar2;
  int local_20;
  uint8 b;
  uint8 g;
  uint8 r;
  int x;
  int width_local;
  uint8 *dst_rgb24_local;
  uint8 *src_raw_local;
  
  _x = dst_rgb24;
  dst_rgb24_local = src_raw;
  for (local_20 = 0; local_20 < width; local_20 = local_20 + 1) {
    uVar1 = *dst_rgb24_local;
    uVar2 = dst_rgb24_local[1];
    *_x = dst_rgb24_local[2];
    _x[1] = uVar2;
    _x[2] = uVar1;
    _x = _x + 3;
    dst_rgb24_local = dst_rgb24_local + 3;
  }
  return;
}

Assistant:

void RAWToRGB24Row_C(const uint8* src_raw, uint8* dst_rgb24, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8 r = src_raw[0];
    uint8 g = src_raw[1];
    uint8 b = src_raw[2];
    dst_rgb24[0] = b;
    dst_rgb24[1] = g;
    dst_rgb24[2] = r;
    dst_rgb24 += 3;
    src_raw += 3;
  }
}